

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParser::setBuffer
          (OpenDDLParser *this,vector<char,_std::allocator<char>_> *buffer)

{
  size_type __new_size;
  const_iterator __first;
  const_iterator __last;
  iterator __result;
  vector<char,_std::allocator<char>_> *buffer_local;
  OpenDDLParser *this_local;
  
  clear(this);
  __new_size = std::vector<char,_std::allocator<char>_>::size(buffer);
  std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,__new_size);
  __first = std::vector<char,_std::allocator<char>_>::begin(buffer);
  __last = std::vector<char,_std::allocator<char>_>::end(buffer);
  __result = std::vector<char,_std::allocator<char>_>::begin(&this->m_buffer);
  std::
  copy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             __first._M_current,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             __last._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             __result._M_current);
  return;
}

Assistant:

void OpenDDLParser::setBuffer( const std::vector<char> &buffer ) {
    clear();
    m_buffer.resize( buffer.size() );
    std::copy( buffer.begin(), buffer.end(), m_buffer.begin() );
}